

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evalexpr.c
# Opt level: O1

void expr_eval(astnode *ptr)

{
  int iVar1;
  
  do {
    while( true ) {
      if (ptr == (astnode *)0x0) {
        return;
      }
      iVar1 = ptr->type;
      if (0x7d < iVar1) break;
      if (iVar1 < 0x3c) {
        switch(iVar1) {
        case 0x21:
          goto switchD_0010533e_caseD_21;
        default:
          goto switchD_0010533e_caseD_22;
        case 0x25:
        case 0x26:
        case 0x2a:
        case 0x2b:
        case 0x2d:
        case 0x2f:
          goto switchD_0010533e_caseD_25;
        }
      }
      if (iVar1 < 0x5e) {
        if ((iVar1 != 0x3c) && (iVar1 != 0x3e)) {
switchD_0010533e_caseD_22:
          yyerror("Warning: Unknown expression type");
          return;
        }
      }
      else if ((iVar1 != 0x5e) && (iVar1 != 0x7c)) goto switchD_0010533e_caseD_22;
switchD_0010533e_caseD_25:
      expr_eval((astnode *)ptr->right);
switchD_0010533e_caseD_21:
      ptr = (astnode *)ptr->left;
    }
    if (0x14a < iVar1) {
      if (iVar1 != 0x14b) {
        if (iVar1 == 0x170) {
          return;
        }
        goto switchD_0010533e_caseD_22;
      }
      goto switchD_0010533e_caseD_21;
    }
    switch(iVar1) {
    case 0x129:
    case 0x12a:
    case 299:
    case 300:
    case 0x12d:
    case 0x12e:
      goto switchD_0010533e_caseD_25;
    case 0x12f:
    case 0x130:
      labelcounter = labelcounter + 1;
      expr_eval((astnode *)ptr->left);
      ptr = (astnode *)ptr->right;
      break;
    default:
      if (iVar1 != 0x7e) goto switchD_0010533e_caseD_22;
      goto switchD_0010533e_caseD_21;
    }
  } while( true );
}

Assistant:

void expr_eval(struct astnode *ptr)
{
	
	if(ptr==NULL)
	{
		
		return;
		
	}
	
	switch(ptr->type)
	{
		case LOR:
		{
			int local=labelcounter++;
			expr_eval(ptr->left);
			//logic or evaluation, only evaluate right side if necessary
			expr_eval(ptr->right);
			break;
		}
		case LAND:
		{
			int local=labelcounter++;
			expr_eval(ptr->left);
			//logic and evaluation, only evaluate right side if necessary
			expr_eval(ptr->right);
			break;
		}
		case '|':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//OR expression
			break;
			
		case '^':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//XOR expression
			break;
			
		case '&':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//AND expression
			break;
			
		case EQ:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Equality expression
			break;
			
		case NE:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Non-equality expression
			break;
			
		case '>':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Larger then
			break;
			
		case '<':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Smaller then
			break;
			
		case GE:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Greater then or equal to.
			break;
			
		case LE:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Less then or equal to.
			break;
			
		case SHL:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Shift left
			break;
			
		case SHR:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Shift Right
			break;
			
		case '+':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Add
			break;
			
		case '-':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Subtract
			break;
			
		case '*':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Multiply
			break;
			
		case '/':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Divide
			break;
			
		case '%':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Modulo
			break;	
			
		case NEGATE:
			expr_eval(ptr->left);
			//Negate
			break;
			
		case '~':
			expr_eval(ptr->left);
			//Not
			break;
		
		case '!':
			expr_eval(ptr->left);
			//Logical not
			break;
			
		case ICONSTANT:
		{
			struct numbernode *num=(struct numbernode *)ptr;
			//Get number 
			break;
		}
		default:
			yyerror("Warning: Unknown expression type");
			break;
		
	}
	
	return;
	
}